

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFJob_argv.cc
# Opt level: O2

void __thiscall anon_unknown.dwarf_2ffcdf::ArgParser::argPages(ArgParser *this)

{
  allocator<char> local_31;
  string local_30;
  
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::clear(&this->accumulated_args);
  QPDFJob::Config::pages((Config *)&local_30);
  std::__shared_ptr<QPDFJob::PagesConfig,_(__gnu_cxx::_Lock_policy)2>::operator=
            (&(this->c_pages).super___shared_ptr<QPDFJob::PagesConfig,_(__gnu_cxx::_Lock_policy)2>,
             (__shared_ptr<QPDFJob::PagesConfig,_(__gnu_cxx::_Lock_policy)2> *)&local_30);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_30._M_string_length);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_30,"pages",&local_31);
  QPDFArgParser::selectOptionTable(&this->ap,&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  return;
}

Assistant:

void
ArgParser::argPages()
{
    this->accumulated_args.clear();
    this->c_pages = c_main->pages();
    this->ap.selectOptionTable(O_PAGES);
}